

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCore.c
# Opt level: O2

Aig_Man_t * Ssw_SignalCorrespondenceRefine(Ssw_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  abctime aVar5;
  Ssw_Sat_t *pSVar6;
  abctime aVar7;
  abctime aVar8;
  Aig_Obj_t *pAVar9;
  Ssw_Pars_t *pSVar10;
  Aig_Man_t *pAVar11;
  int iVar12;
  char *pcVar13;
  int fVerbose;
  int iVar14;
  char *in_RSI;
  uint uVar15;
  Ssw_Man_t *p_00;
  Aig_Man_t *pAVar16;
  int iVar17;
  uint uVar18;
  int local_44;
  
  aVar5 = Abc_Clock();
  p_00 = (Ssw_Man_t *)p->ppClasses;
  iVar1 = Ssw_ClassesLitNum((Ssw_Cla_t *)p_00);
  p->nLitsBeg = iVar1;
  pSVar10 = p->pPars;
  pAVar11 = p->pAig;
  p->nNodesBeg = pAVar11->nObjs[6] + pAVar11->nObjs[5];
  p->nRegsBeg = pAVar11->nRegs;
  if (pSVar10->fVerbose != 0) {
    Abc_Print((int)p_00,"Before BMC: ");
    p_00 = (Ssw_Man_t *)p->ppClasses;
    in_RSI = (char *)0x0;
    Ssw_ClassesPrint((Ssw_Cla_t *)p_00,0);
    pSVar10 = p->pPars;
  }
  if (pSVar10->fLatchCorr == 0) {
    pSVar6 = Ssw_SatStart(0);
    p->pMSat = pSVar6;
    if (p->pPars->fConstrs == 0) {
      Ssw_ManSweepBmc(p);
    }
    else {
      Ssw_ManSweepBmcConstr(p);
    }
    Ssw_SatStop(p->pMSat);
    p->pMSat = (Ssw_Sat_t *)0x0;
    p_00 = p;
    Ssw_ManCleanup(p);
    pSVar10 = p->pPars;
  }
  if (pSVar10->fVerbose != 0) {
    Abc_Print((int)p_00,"After  BMC: ");
    p_00 = (Ssw_Man_t *)p->ppClasses;
    in_RSI = (char *)0x0;
    Ssw_ClassesPrint((Ssw_Cla_t *)p_00,0);
    pSVar10 = p->pPars;
  }
  if ((code *)pSVar10->pFunc != (code *)0x0) {
    (*(code *)pSVar10->pFunc)(pSVar10->pData);
    p_00 = (Ssw_Man_t *)p->pPars->pData;
    (*(code *)p->pPars->pFunc)();
    pSVar10 = p->pPars;
  }
  uVar3 = pSVar10->nStepsMax;
  if (uVar3 == 0) {
    Abc_Print((int)p_00,"Stopped signal correspondence after BMC.\n");
    uVar18 = 0xffffffff;
  }
  else {
    local_44 = 0;
    iVar17 = 0;
    iVar14 = 0;
    iVar1 = 0;
    for (uVar18 = 0; uVar18 != uVar3; uVar18 = uVar18 + 1) {
      if (uVar18 == pSVar10->nItersStop && -1 < pSVar10->nItersStop) {
        pAVar11 = Ssw_SpeculativeReduction(p);
        Aig_ManDumpBlif(pAVar11,"srm.blif",(Vec_Ptr_t *)0x0,(Vec_Ptr_t *)0x0);
        Aig_ManStop(pAVar11);
        iVar1 = (int)pAVar11;
        Abc_Print(iVar1,"Iterative refinement is stopped before iteration %d.\n",(ulong)uVar18);
        Abc_Print(iVar1,"The network is reduced using candidate equivalences.\n");
        Abc_Print(iVar1,"Speculatively reduced miter is saved in file \"%s\".\n","srm.blif");
        Abc_Print(iVar1,"If the miter is SAT, the reduced result is incorrect.\n");
        goto LAB_0050b24b;
      }
      aVar7 = Abc_Clock();
      pSVar6 = Ssw_SatStart(0);
      p->pMSat = pSVar6;
      pSVar10 = p->pPars;
      if (pSVar10->fLatchCorrOpt == 0) {
        if (pSVar10->fConstrs == 0) {
          if (pSVar10->fDynamic == 0) {
            iVar2 = Ssw_ManSweep(p);
          }
          else {
            iVar2 = Ssw_ManSweepDyn(p);
          }
        }
        else {
          iVar2 = Ssw_ManSweepConstr(p);
        }
        pSVar10 = p->pPars;
        pSVar10->nConflicts = pSVar10->nConflicts + (int)(p->pMSat->pSat->stats).conflicts;
        if (pSVar10->fVerbose != 0) {
          uVar3 = Ssw_ClassesCand1Num(p->ppClasses);
          uVar4 = Ssw_ClassesClassNum(p->ppClasses);
          uVar15 = p->pFrames->nObjs[6] + p->pFrames->nObjs[5];
          iVar1 = 0x7df4eb;
          Abc_Print(uVar15,"%3d : C =%7d. Cl =%7d. LR =%6d. NR =%6d. ",(ulong)uVar18,(ulong)uVar3,
                    (ulong)uVar4,(ulong)(uint)p->nConstrReduced,(ulong)uVar15);
          if (p->pPars->fDynamic != 0) {
            Abc_Print(uVar15,"Cex =%5d. ",(ulong)(uint)(p->nSatCallsSat - iVar14),0x50afc6);
            iVar1 = 0x7df520;
            Abc_Print(uVar15,"R =%4d. ",(ulong)(uint)(p->nRecycles - iVar17));
          }
          iVar14 = p->nSatFailsReal;
          pAVar11 = p->pAig;
          pcVar13 = "-";
          if (pAVar11->nTruePos == 1) {
            pAVar16 = pAVar11;
            pAVar9 = Aig_ManCo(pAVar11,iVar1);
            uVar15 = (uint)pAVar16;
            if (pAVar11->pReprs == (Aig_Obj_t **)0x0) {
              pAVar9 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar9 = pAVar11->pReprs
                       [*(int *)(((ulong)pAVar9->pFanin0 & 0xfffffffffffffffe) + 0x24)];
            }
            pcVar13 = "+";
            if (pAVar9 != pAVar11->pConst1) {
              pcVar13 = "-";
            }
          }
          Abc_Print(uVar15,"F =%5d. %s ",(ulong)(uint)(iVar14 - local_44),pcVar13);
          Abc_Print(uVar15,"%s =","T");
          aVar8 = Abc_Clock();
          in_RSI = "%9.2f sec\n";
          Abc_Print(uVar15,"%9.2f sec\n",(double)(aVar8 - aVar7) / 1000000.0);
          pSVar10 = p->pPars;
        }
        if ((pSVar10->fStopWhenGone != 0) && (pAVar11 = p->pAig, pAVar11->nTruePos == 1)) {
          pAVar9 = Aig_ManCo(pAVar11,(int)in_RSI);
          if (pAVar11->pReprs == (Aig_Obj_t **)0x0) {
            pAVar9 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar9 = pAVar11->pReprs[*(int *)(((ulong)pAVar9->pFanin0 & 0xfffffffffffffffe) + 0x24)]
            ;
          }
          if (pAVar9 != pAVar11->pConst1) {
            printf("Iterative refinement is stopped after iteration %d\n",(ulong)uVar18);
            puts("because the property output is no longer a candidate constant.");
            p->nLitsEnd = p->nLitsBeg;
            p->nNodesEnd = p->nNodesBeg;
            p->nRegsEnd = p->nRegsBeg;
            Ssw_SatStop(p->pMSat);
            p->pMSat = (Ssw_Sat_t *)0x0;
            Ssw_ManCleanup(p);
            Aig_ManSetPhase(p->pAig);
            Aig_ManCleanMarkB(p->pAig);
            pAVar11 = Aig_ManDupSimple(p->pAig);
            return pAVar11;
          }
        }
      }
      else {
        iVar2 = Ssw_ManSweepLatch(p);
        if (p->pPars->fVerbose != 0) {
          uVar3 = Ssw_ClassesCand1Num(p->ppClasses);
          uVar4 = Ssw_ClassesClassNum(p->ppClasses);
          uVar15 = p->nRecycles - iVar17;
          Abc_Print(uVar15,"%3d : C =%7d. Cl =%7d. Pr =%6d. Cex =%5d. R =%4d. F =%4d. ",
                    (ulong)uVar18,(ulong)uVar3,(ulong)uVar4,(ulong)(uint)(p->nSatProof - iVar1),
                    (ulong)(uint)(p->nSatCallsSat - iVar14),(ulong)uVar15,
                    (ulong)(uint)(p->nSatFailsReal - local_44));
          Abc_Print(uVar15,"%s =","T");
          aVar8 = Abc_Clock();
          in_RSI = "%9.2f sec\n";
          Abc_Print(uVar15,"%9.2f sec\n",(double)(aVar8 - aVar7) / 1000000.0);
        }
      }
      iVar1 = p->nSatProof;
      iVar14 = p->nSatCallsSat;
      iVar17 = p->nRecycles;
      pSVar6 = p->pMSat;
      iVar12 = pSVar6->nSatVars;
      if (pSVar6->nSatVars < p->nVarsMax) {
        iVar12 = p->nVarsMax;
      }
      local_44 = p->nSatFailsReal;
      p->nVarsMax = iVar12;
      iVar12 = pSVar6->nSolverCalls;
      if (pSVar6->nSolverCalls < p->nCallsMax) {
        iVar12 = p->nCallsMax;
      }
      p->nCallsMax = iVar12;
      Ssw_SatStop(pSVar6);
      p->pMSat = (Ssw_Sat_t *)0x0;
      p_00 = p;
      Ssw_ManCleanup(p);
      if (iVar2 == 0) goto LAB_0050b24b;
      pSVar10 = p->pPars;
      if ((code *)pSVar10->pFunc != (code *)0x0) {
        p_00 = (Ssw_Man_t *)pSVar10->pData;
        (*(code *)pSVar10->pFunc)();
        pSVar10 = p->pPars;
      }
      uVar3 = pSVar10->nStepsMax;
    }
    Abc_Print((int)p_00,"Stopped signal correspondence after %d refiment iterations.\n",(ulong)uVar3
             );
    uVar18 = uVar3;
  }
LAB_0050b24b:
  p->pPars->nIters = uVar18 + 1;
  aVar7 = Abc_Clock();
  p->timeTotal = aVar7 - aVar5;
  Ssw_ManUpdateEquivs(p,p->pAig,fVerbose);
  pAVar11 = Aig_ManDupRepr(p->pAig,0);
  Aig_ManSeqCleanup(pAVar11);
  iVar1 = Ssw_ClassesLitNum(p->ppClasses);
  p->nLitsEnd = iVar1;
  p->nNodesEnd = pAVar11->nObjs[6] + pAVar11->nObjs[5];
  p->nRegsEnd = pAVar11->nRegs;
  Aig_ManSetPhase(p->pAig);
  Aig_ManCleanMarkB(p->pAig);
  return pAVar11;
}

Assistant:

Aig_Man_t * Ssw_SignalCorrespondenceRefine( Ssw_Man_t * p )
{
    int nSatProof, nSatCallsSat, nRecycles, nSatFailsReal, nUniques;
    Aig_Man_t * pAigNew;
    int RetValue, nIter = -1;
    abctime clk, clkTotal = Abc_Clock();
    // get the starting stats
    p->nLitsBeg  = Ssw_ClassesLitNum( p->ppClasses );
    p->nNodesBeg = Aig_ManNodeNum(p->pAig);
    p->nRegsBeg  = Aig_ManRegNum(p->pAig);
    // refine classes using BMC
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "Before BMC: " );
        Ssw_ClassesPrint( p->ppClasses, 0 );
    }
    if ( !p->pPars->fLatchCorr )
    {
        p->pMSat = Ssw_SatStart( 0 );
        if ( p->pPars->fConstrs )
            Ssw_ManSweepBmcConstr( p );
        else
            Ssw_ManSweepBmc( p );
        Ssw_SatStop( p->pMSat );
        p->pMSat = NULL;
        Ssw_ManCleanup( p );
    }
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "After  BMC: " );
        Ssw_ClassesPrint( p->ppClasses, 0 );
    }
    // apply semi-formal filtering
/*
    if ( p->pPars->fSemiFormal )
    {
        Aig_Man_t * pSRed;
        Ssw_FilterUsingSemi( p, 0, 2000, p->pPars->fVerbose );
//        Ssw_FilterUsingSemi( p, 1, 100000, p->pPars->fVerbose );
        pSRed = Ssw_SpeculativeReduction( p );
        Aig_ManDumpBlif( pSRed, "srm.blif", NULL, NULL );
        Aig_ManStop( pSRed );
    }
*/
    if ( p->pPars->pFunc )
    {
        ((int (*)(void *))p->pPars->pFunc)( p->pPars->pData );
        ((int (*)(void *))p->pPars->pFunc)( p->pPars->pData );
    }
    if ( p->pPars->nStepsMax == 0 )
    {
        Abc_Print( 1, "Stopped signal correspondence after BMC.\n" );
        goto finalize;
    }
    // refine classes using induction
    nSatProof = nSatCallsSat = nRecycles = nSatFailsReal = nUniques = 0;
    for ( nIter = 0; ; nIter++ )
    {
        if ( p->pPars->nStepsMax == nIter )
        {
            Abc_Print( 1, "Stopped signal correspondence after %d refiment iterations.\n", nIter );
            goto finalize;
        }
        if ( p->pPars->nItersStop >= 0 && p->pPars->nItersStop == nIter )
        {
            Aig_Man_t * pSRed = Ssw_SpeculativeReduction( p );
            Aig_ManDumpBlif( pSRed, "srm.blif", NULL, NULL );
            Aig_ManStop( pSRed );
            Abc_Print( 1, "Iterative refinement is stopped before iteration %d.\n", nIter );
            Abc_Print( 1, "The network is reduced using candidate equivalences.\n" );
            Abc_Print( 1, "Speculatively reduced miter is saved in file \"%s\".\n", "srm.blif" );
            Abc_Print( 1, "If the miter is SAT, the reduced result is incorrect.\n" );
            break;
        }

clk = Abc_Clock();
        p->pMSat = Ssw_SatStart( 0 );
        if ( p->pPars->fLatchCorrOpt )
        {
            RetValue = Ssw_ManSweepLatch( p );
            if ( p->pPars->fVerbose )
            {
                Abc_Print( 1, "%3d : C =%7d. Cl =%7d. Pr =%6d. Cex =%5d. R =%4d. F =%4d. ",
                    nIter, Ssw_ClassesCand1Num(p->ppClasses), Ssw_ClassesClassNum(p->ppClasses),
                    p->nSatProof-nSatProof, p->nSatCallsSat-nSatCallsSat,
                    p->nRecycles-nRecycles, p->nSatFailsReal-nSatFailsReal );
                ABC_PRT( "T", Abc_Clock() - clk );
            }
        }
        else
        {
            if ( p->pPars->fConstrs )
                RetValue = Ssw_ManSweepConstr( p );
            else if ( p->pPars->fDynamic )
                RetValue = Ssw_ManSweepDyn( p );
            else
                RetValue = Ssw_ManSweep( p );

            p->pPars->nConflicts += p->pMSat->pSat->stats.conflicts;
            if ( p->pPars->fVerbose )
            {
                Abc_Print( 1, "%3d : C =%7d. Cl =%7d. LR =%6d. NR =%6d. ",
                    nIter, Ssw_ClassesCand1Num(p->ppClasses), Ssw_ClassesClassNum(p->ppClasses),
                    p->nConstrReduced, Aig_ManNodeNum(p->pFrames) );
                if ( p->pPars->fDynamic )
                {
                    Abc_Print( 1, "Cex =%5d. ", p->nSatCallsSat-nSatCallsSat );
                    Abc_Print( 1, "R =%4d. ",   p->nRecycles-nRecycles );
                }
                Abc_Print( 1, "F =%5d. %s ", p->nSatFailsReal-nSatFailsReal,
                    (Saig_ManPoNum(p->pAig)==1 && Ssw_ObjIsConst1Cand(p->pAig,Aig_ObjFanin0(Aig_ManCo(p->pAig,0))))? "+" : "-" );
                ABC_PRT( "T", Abc_Clock() - clk );
            }
//            if ( p->pPars->fDynamic && p->nSatCallsSat-nSatCallsSat < 100 )
//                p->pPars->nBTLimit = 10000;

            if ( p->pPars->fStopWhenGone && Saig_ManPoNum(p->pAig) == 1 && !Ssw_ObjIsConst1Cand(p->pAig,Aig_ObjFanin0(Aig_ManCo(p->pAig,0))) )
            {
                printf( "Iterative refinement is stopped after iteration %d\n", nIter );
                printf( "because the property output is no longer a candidate constant.\n" );
                // prepare to quite
                p->nLitsEnd  = p->nLitsBeg;
                p->nNodesEnd = p->nNodesBeg;
                p->nRegsEnd  = p->nRegsBeg;
                // cleanup
                Ssw_SatStop( p->pMSat );
                p->pMSat = NULL;
                Ssw_ManCleanup( p );
                // cleanup
                Aig_ManSetPhase( p->pAig );
                Aig_ManCleanMarkB( p->pAig );
                return Aig_ManDupSimple( p->pAig );
            }
        }
        nSatProof     = p->nSatProof;
        nSatCallsSat  = p->nSatCallsSat;
        nRecycles     = p->nRecycles;
        nSatFailsReal = p->nSatFailsReal;
        nUniques      = p->nUniques;

        p->nVarsMax  = Abc_MaxInt( p->nVarsMax,  p->pMSat->nSatVars );
        p->nCallsMax = Abc_MaxInt( p->nCallsMax, p->pMSat->nSolverCalls );
        Ssw_SatStop( p->pMSat );
        p->pMSat = NULL;
        Ssw_ManCleanup( p );
        if ( !RetValue )
            break;
        if ( p->pPars->pFunc )
            ((int (*)(void *))p->pPars->pFunc)( p->pPars->pData );
    }

finalize:
    p->pPars->nIters = nIter + 1;
p->timeTotal = Abc_Clock() - clkTotal;

    Ssw_ManUpdateEquivs( p, p->pAig, p->pPars->fVerbose );
    pAigNew = Aig_ManDupRepr( p->pAig, 0 );
    Aig_ManSeqCleanup( pAigNew );
//Ssw_ClassesPrint( p->ppClasses, 1 );
    // get the final stats
    p->nLitsEnd  = Ssw_ClassesLitNum( p->ppClasses );
    p->nNodesEnd = Aig_ManNodeNum(pAigNew);
    p->nRegsEnd  = Aig_ManRegNum(pAigNew);
    // cleanup
    Aig_ManSetPhase( p->pAig );
    Aig_ManCleanMarkB( p->pAig );
    return pAigNew;
}